

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O2

int av1_choose_var_based_partitioning
              (AV1_COMP *cpi,TileInfo *tile,ThreadData_conflict *td,MACROBLOCK *x,int mi_row,
              int mi_col)

{
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int *piVar1;
  BLOCK_SIZE BVar2;
  uint8_t uVar3;
  ushort uVar4;
  ushort uVar5;
  undefined1 uVar6;
  aom_tune_content aVar7;
  uint32_t uVar8;
  SOURCE_SAD SVar9;
  SequenceHeader *pSVar10;
  MB_MODE_INFO *pMVar11;
  MB_MODE_INFO *pMVar12;
  double dVar13;
  int64_t threshold;
  int64_t threshold_00;
  int64_t threshold_01;
  _Bool _Var14;
  byte bVar15;
  char cVar16;
  int idx;
  uint uVar17;
  FULLPEL_MV FVar18;
  int iVar19;
  FULLPEL_MV FVar20;
  int iVar21;
  FULLPEL_MV FVar22;
  NOISE_LEVEL NVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  YV12_BUFFER_CONFIG *pYVar27;
  RefCntBuffer *pRVar28;
  YV12_BUFFER_CONFIG *pYVar29;
  YV12_BUFFER_CONFIG *pYVar30;
  scale_factors *psVar31;
  AV1_PRIMARY *pAVar32;
  VPartVar *v;
  long lVar33;
  long lVar34;
  int *piVar35;
  uint8_t *puVar36;
  BLOCK_SIZE bsize;
  PART_EVAL_STATUS force_split;
  int iVar37;
  uint uVar38;
  scale_factors *scale;
  long lVar39;
  long lVar40;
  ulong uVar41;
  BLOCK_SIZE BVar42;
  ushort uVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  long lVar47;
  sbyte sVar48;
  int lvl2_idx_3;
  int iVar49;
  uint64_t blk_sad;
  long lVar50;
  VPartVar *v_00;
  int min_8x8_var;
  MV_REFERENCE_FRAME ref_frame;
  uint uVar51;
  int iVar52;
  int iVar53;
  uint uVar54;
  int_mv *subpel_mv;
  uint8_t *puVar55;
  int iVar56;
  long lVar57;
  int *piVar58;
  uint uVar59;
  ulong uVar60;
  int part_idx;
  uint8_t *puVar61;
  int lvl3_idx;
  uint uVar62;
  int iVar63;
  long lVar64;
  long lVar65;
  int iVar66;
  undefined4 *puVar67;
  undefined4 *puVar68;
  VPartVar *v_01;
  int lvl2_idx_1;
  long lVar69;
  uint8_t *puVar70;
  uint8_t *puVar71;
  int lvl2_idx;
  uint uVar72;
  buf_2d *pbVar73;
  long lVar74;
  long lVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  char local_322;
  short local_308;
  long local_2f8;
  long local_2e8;
  long local_2c0;
  long local_2b8;
  ulong local_2b0;
  long local_2a8;
  uint8_t *local_2a0;
  long local_290;
  short local_278;
  long local_270;
  uint local_260;
  short local_250;
  uint uv_sad [2];
  int64_t local_208;
  int64_t iStack_200;
  int64_t local_1f8;
  int64_t iStack_1f0;
  int64_t local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  int avg_16x16 [4] [4];
  int sum [4];
  uint sse [4];
  PART_EVAL_STATUS local_148 [5];
  PART_EVAL_STATUS local_143 [16];
  PART_EVAL_STATUS aPStack_133 [75];
  int local_e8 [4];
  int src_avg [4];
  scale_factors sf_no_scale;
  int maxvar_16x16 [4] [4];
  int minvar_16x16 [4] [4];
  
  iVar56 = (cpi->common).width;
  iVar63 = (cpi->common).height;
  av1_setup_scale_factors_for_frame(&sf_no_scale,iVar56,iVar63,iVar56,iVar63);
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    bVar78 = true;
  }
  else if (cpi->ppi->use_svc == 0) {
    bVar78 = false;
  }
  else {
    bVar78 = (cpi->svc).layer_context[(cpi->svc).temporal_layer_id].is_key_frame != 0;
  }
  pSVar10 = (cpi->common).seq_params;
  BVar2 = pSVar10->sb_size;
  bsize = (BVar2 != BLOCK_64X64) * '\x03' | BLOCK_64X64;
  if ((((cpi->sf).rt_sf.skip_encoding_non_reference_slide_change != 0) &&
      ((cpi->rc).high_source_sad != 0)) && ((cpi->ppi->rtc_ref).non_reference_frame != 0)) {
    av1_set_fixed_partitioning
              (cpi,tile,(cpi->common).mi_params.mi_grid_base +
                        ((cpi->common).mi_params.mi_stride * mi_row + mi_col),mi_row,mi_col,bsize);
    x->force_zeromv_skip_for_sb = 1;
    return 0;
  }
  local_208 = (cpi->vbp_info).thresholds[0];
  iStack_200 = (cpi->vbp_info).thresholds[1];
  local_1f8 = (cpi->vbp_info).thresholds[2];
  iStack_1f0 = (cpi->vbp_info).thresholds[3];
  local_1e8 = (cpi->vbp_info).thresholds[4];
  if ((cpi->src_sad_blk_64x64 == (uint64_t *)0x0) ||
     ((cpi->svc).spatial_layer_id != (cpi->svc).number_spatial_layers + -1)) {
    blk_sad = 0;
  }
  else {
    iVar56 = pSVar10->mib_size >> (BVar2 == BLOCK_128X128);
    blk_sad = cpi->src_sad_blk_64x64
              [(mi_row / iVar56) * (((cpi->common).mi_params.mi_cols + iVar56 + -1) / iVar56) +
               mi_col / iVar56];
  }
  uVar51 = *(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7;
  if ((((cpi->oxcf).q_cfg.aq_mode == '\x03') && ((cpi->common).seg.enabled != '\0')) &&
     (uVar51 - 1 < 2)) {
    iVar56 = av1_get_qindex(&(cpi->common).seg,uVar51,(cpi->common).quant_params.base_qindex);
    _Var14 = true;
  }
  else {
    iVar56 = (cpi->common).quant_params.base_qindex;
    _Var14 = false;
  }
  set_vbp_thresholds(cpi,&local_208,blk_sad,iVar56,(x->content_state_sb).low_sumdiff,
                     (x->content_state_sb).source_sad_nonrd,(x->content_state_sb).source_sad_rd,
                     _Var14,(x->content_state_sb).lighting_change);
  puVar70 = x->plane[0].src.buf;
  iVar56 = x->plane[0].src.stride;
  local_148[0] = '\0';
  (x->part_search_info).variance_low[0x59] = '\0';
  (x->part_search_info).variance_low[0x5a] = '\0';
  (x->part_search_info).variance_low[0x5b] = '\0';
  (x->part_search_info).variance_low[0x5c] = '\0';
  (x->part_search_info).variance_low[0x5d] = '\0';
  (x->part_search_info).variance_low[0x5e] = '\0';
  (x->part_search_info).variance_low[0x5f] = '\0';
  (x->part_search_info).variance_low[0x60] = '\0';
  (x->part_search_info).variance_low[0x61] = '\0';
  (x->part_search_info).variance_low[0x62] = '\0';
  (x->part_search_info).variance_low[99] = '\0';
  (x->part_search_info).variance_low[100] = '\0';
  (x->part_search_info).variance_low[0x65] = '\0';
  (x->part_search_info).variance_low[0x66] = '\0';
  (x->part_search_info).variance_low[0x67] = '\0';
  (x->part_search_info).variance_low[0x68] = '\0';
  (x->part_search_info).variance_low[0x50] = '\0';
  (x->part_search_info).variance_low[0x51] = '\0';
  (x->part_search_info).variance_low[0x52] = '\0';
  (x->part_search_info).variance_low[0x53] = '\0';
  (x->part_search_info).variance_low[0x54] = '\0';
  (x->part_search_info).variance_low[0x55] = '\0';
  (x->part_search_info).variance_low[0x56] = '\0';
  (x->part_search_info).variance_low[0x57] = '\0';
  (x->part_search_info).variance_low[0x58] = '\0';
  (x->part_search_info).variance_low[0x59] = '\0';
  (x->part_search_info).variance_low[0x5a] = '\0';
  (x->part_search_info).variance_low[0x5b] = '\0';
  (x->part_search_info).variance_low[0x5c] = '\0';
  (x->part_search_info).variance_low[0x5d] = '\0';
  (x->part_search_info).variance_low[0x5e] = '\0';
  (x->part_search_info).variance_low[0x5f] = '\0';
  (x->part_search_info).variance_low[0x40] = '\0';
  (x->part_search_info).variance_low[0x41] = '\0';
  (x->part_search_info).variance_low[0x42] = '\0';
  (x->part_search_info).variance_low[0x43] = '\0';
  (x->part_search_info).variance_low[0x44] = '\0';
  (x->part_search_info).variance_low[0x45] = '\0';
  (x->part_search_info).variance_low[0x46] = '\0';
  (x->part_search_info).variance_low[0x47] = '\0';
  (x->part_search_info).variance_low[0x48] = '\0';
  (x->part_search_info).variance_low[0x49] = '\0';
  (x->part_search_info).variance_low[0x4a] = '\0';
  (x->part_search_info).variance_low[0x4b] = '\0';
  (x->part_search_info).variance_low[0x4c] = '\0';
  (x->part_search_info).variance_low[0x4d] = '\0';
  (x->part_search_info).variance_low[0x4e] = '\0';
  (x->part_search_info).variance_low[0x4f] = '\0';
  (x->part_search_info).variance_low[0x30] = '\0';
  (x->part_search_info).variance_low[0x31] = '\0';
  (x->part_search_info).variance_low[0x32] = '\0';
  (x->part_search_info).variance_low[0x33] = '\0';
  (x->part_search_info).variance_low[0x34] = '\0';
  (x->part_search_info).variance_low[0x35] = '\0';
  (x->part_search_info).variance_low[0x36] = '\0';
  (x->part_search_info).variance_low[0x37] = '\0';
  (x->part_search_info).variance_low[0x38] = '\0';
  (x->part_search_info).variance_low[0x39] = '\0';
  (x->part_search_info).variance_low[0x3a] = '\0';
  (x->part_search_info).variance_low[0x3b] = '\0';
  (x->part_search_info).variance_low[0x3c] = '\0';
  (x->part_search_info).variance_low[0x3d] = '\0';
  (x->part_search_info).variance_low[0x3e] = '\0';
  (x->part_search_info).variance_low[0x3f] = '\0';
  (x->part_search_info).variance_low[0x20] = '\0';
  (x->part_search_info).variance_low[0x21] = '\0';
  (x->part_search_info).variance_low[0x22] = '\0';
  (x->part_search_info).variance_low[0x23] = '\0';
  (x->part_search_info).variance_low[0x24] = '\0';
  (x->part_search_info).variance_low[0x25] = '\0';
  (x->part_search_info).variance_low[0x26] = '\0';
  (x->part_search_info).variance_low[0x27] = '\0';
  (x->part_search_info).variance_low[0x28] = '\0';
  (x->part_search_info).variance_low[0x29] = '\0';
  (x->part_search_info).variance_low[0x2a] = '\0';
  (x->part_search_info).variance_low[0x2b] = '\0';
  (x->part_search_info).variance_low[0x2c] = '\0';
  (x->part_search_info).variance_low[0x2d] = '\0';
  (x->part_search_info).variance_low[0x2e] = '\0';
  (x->part_search_info).variance_low[0x2f] = '\0';
  (x->part_search_info).variance_low[0x10] = '\0';
  (x->part_search_info).variance_low[0x11] = '\0';
  (x->part_search_info).variance_low[0x12] = '\0';
  (x->part_search_info).variance_low[0x13] = '\0';
  (x->part_search_info).variance_low[0x14] = '\0';
  (x->part_search_info).variance_low[0x15] = '\0';
  (x->part_search_info).variance_low[0x16] = '\0';
  (x->part_search_info).variance_low[0x17] = '\0';
  (x->part_search_info).variance_low[0x18] = '\0';
  (x->part_search_info).variance_low[0x19] = '\0';
  (x->part_search_info).variance_low[0x1a] = '\0';
  (x->part_search_info).variance_low[0x1b] = '\0';
  (x->part_search_info).variance_low[0x1c] = '\0';
  (x->part_search_info).variance_low[0x1d] = '\0';
  (x->part_search_info).variance_low[0x1e] = '\0';
  (x->part_search_info).variance_low[0x1f] = '\0';
  (x->part_search_info).variance_low[0] = '\0';
  (x->part_search_info).variance_low[1] = '\0';
  (x->part_search_info).variance_low[2] = '\0';
  (x->part_search_info).variance_low[3] = '\0';
  (x->part_search_info).variance_low[4] = '\0';
  (x->part_search_info).variance_low[5] = '\0';
  (x->part_search_info).variance_low[6] = '\0';
  (x->part_search_info).variance_low[7] = '\0';
  (x->part_search_info).variance_low[8] = '\0';
  (x->part_search_info).variance_low[9] = '\0';
  (x->part_search_info).variance_low[10] = '\0';
  (x->part_search_info).variance_low[0xb] = '\0';
  (x->part_search_info).variance_low[0xc] = '\0';
  (x->part_search_info).variance_low[0xd] = '\0';
  (x->part_search_info).variance_low[0xe] = '\0';
  (x->part_search_info).variance_low[0xf] = '\0';
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
LAB_00222828:
    bVar76 = false;
  }
  else {
    lVar26 = (long)(cpi->common).remapped_ref_idx[0];
    if ((lVar26 == -1) ||
       (pRVar28 = (cpi->common).ref_frame_map[lVar26], pRVar28 == (RefCntBuffer *)0x0)) {
      bVar76 = false;
      bVar78 = true;
    }
    else {
      if (((pRVar28->buf).field_3.field_0.y_crop_height == (cpi->common).height) &&
         ((pRVar28->buf).field_2.field_0.y_crop_width == (cpi->common).width)) goto LAB_00222828;
      pYVar27 = av1_get_scaled_ref_frame(cpi,1);
      bVar78 = (bool)(bVar78 | pYVar27 == (YV12_BUFFER_CONFIG *)0x0);
      bVar76 = true;
    }
  }
  x->source_variance = 0xffffffff;
  xd = &x->e_mbd;
  if (((cpi->sf).rt_sf.use_nonrd_pick_mode != 0) &&
     (kLowSad < (x->content_state_sb).source_sad_nonrd)) {
    uVar17 = av1_get_perpixel_variance_facade
                       (cpi,xd,&x->plane[0].src,((cpi->common).seq_params)->sb_size,0);
    x->source_variance = uVar17;
  }
  if (bVar78) {
    uv_sad[0] = 0;
    uv_sad[1] = 0;
    uVar17 = 0xffffffff;
    local_322 = '\x01';
    local_2a0 = (uint8_t *)0x0;
    iVar63 = 0;
  }
  else {
    uVar3 = ((cpi->common).seq_params)->monochrome;
    pMVar12 = *(x->e_mbd).mi;
    if (bVar76) {
      pYVar27 = av1_get_scaled_ref_frame(cpi,1);
    }
    else {
      lVar26 = (long)(cpi->common).remapped_ref_idx[0];
      if (lVar26 == -1) {
        pRVar28 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar28 = (cpi->common).ref_frame_map[lVar26];
      }
      pYVar27 = &pRVar28->buf;
      if (pRVar28 == (RefCntBuffer *)0x0) {
        pYVar27 = (YV12_BUFFER_CONFIG *)0x0;
      }
    }
    bVar79 = true;
    bVar77 = true;
    if ((cpi->ref_frame_flags & 1U) == 0) {
      bVar77 = 1 < (cpi->svc).number_spatial_layers;
    }
    if (((cpi->ppi->rtc_ref).set_ref_frame_config == 0) &&
       ((cpi->sf).rt_sf.use_nonrd_altref_frame == 0)) {
      if ((cpi->sf).rt_sf.use_comp_ref_nonrd == 0) {
        bVar79 = false;
      }
      else {
        bVar79 = (cpi->sf).rt_sf.ref_frame_comp_nonrd[2] == 1;
      }
    }
    iVar63 = (uint)(uVar3 == '\0') * 2;
    iVar45 = iVar63 + 1;
    pYVar29 = (YV12_BUFFER_CONFIG *)0x0;
    if ((cpi->ref_frame_flags & 8U) == 0) {
      uVar17 = 0xffffffff;
    }
    else {
      uVar17 = 0xffffffff;
      if ((cpi->svc).number_spatial_layers == 1) {
        if (((bool)((x->content_state_sb).source_sad_nonrd == kZeroSad & bVar77)) ||
           (iVar53 = (cpi->common).remapped_ref_idx[3], iVar53 == -1)) {
LAB_00222b0b:
          pYVar29 = (YV12_BUFFER_CONFIG *)0x0;
        }
        else {
          pRVar28 = (cpi->common).ref_frame_map[iVar53];
          if (pRVar28 == (RefCntBuffer *)0x0) goto LAB_00222b0b;
          if (((pRVar28->buf).field_3.field_0.y_crop_height == (cpi->common).height) &&
             ((pRVar28->buf).field_2.field_0.y_crop_width == (cpi->common).width)) {
            pYVar29 = &pRVar28->buf;
            if (pYVar29 != pYVar27) {
              psVar31 = (cpi->common).ref_scale_factors + iVar53;
LAB_00222a9f:
              av1_setup_pre_planes(xd,0,pYVar29,mi_row,mi_col,psVar31,iVar45);
              uVar17 = (*cpi->ppi->fn_ptr[bsize].sdf)
                                 (x->plane[0].src.buf,x->plane[0].src.stride,
                                  (x->e_mbd).plane[0].pre[0].buf,(x->e_mbd).plane[0].pre[0].stride);
              goto LAB_00222b13;
            }
          }
          else {
            pYVar29 = av1_get_scaled_ref_frame(cpi,4);
            if (pYVar29 == (YV12_BUFFER_CONFIG *)0x0) goto LAB_00222b0b;
            if (pYVar29 != pYVar27) {
              psVar31 = (scale_factors *)0x0;
              goto LAB_00222a9f;
            }
          }
        }
        uVar17 = 0xffffffff;
      }
    }
LAB_00222b13:
    if ((bool)((cpi->svc).number_spatial_layers == 1 & bVar79)) {
      if ((((cpi->ref_frame_flags & 0x40) == 0) ||
          ((bool)((x->content_state_sb).source_sad_nonrd == kZeroSad & bVar77))) ||
         (iVar53 = (cpi->common).remapped_ref_idx[6], iVar53 == -1)) {
LAB_00222c64:
        pYVar30 = (YV12_BUFFER_CONFIG *)0x0;
      }
      else {
        pRVar28 = (cpi->common).ref_frame_map[iVar53];
        if (pRVar28 == (RefCntBuffer *)0x0) goto LAB_00222c64;
        if (((pRVar28->buf).field_3.field_0.y_crop_height == (cpi->common).height) &&
           ((pRVar28->buf).field_2.field_0.y_crop_width == (cpi->common).width)) {
          pYVar30 = &pRVar28->buf;
          if (pYVar30 != pYVar27) {
            psVar31 = (cpi->common).ref_scale_factors + iVar53;
LAB_00222bff:
            av1_setup_pre_planes(xd,0,pYVar30,mi_row,mi_col,psVar31,iVar45);
            uVar46 = (*cpi->ppi->fn_ptr[bsize].sdf)
                               (x->plane[0].src.buf,x->plane[0].src.stride,
                                (x->e_mbd).plane[0].pre[0].buf,(x->e_mbd).plane[0].pre[0].stride);
            uVar60 = (ulong)uVar46;
            goto LAB_00222c69;
          }
        }
        else {
          pYVar30 = av1_get_scaled_ref_frame(cpi,7);
          if (pYVar30 == (YV12_BUFFER_CONFIG *)0x0) goto LAB_00222c64;
          if (pYVar30 != pYVar27) {
            psVar31 = (scale_factors *)0x0;
            goto LAB_00222bff;
          }
        }
      }
      uVar60 = 0xffffffff;
    }
    else {
      pYVar30 = (YV12_BUFFER_CONFIG *)0x0;
      uVar60 = 0xffffffff;
    }
LAB_00222c69:
    uVar25 = (uint)uVar60;
    uVar46 = 0xffffffff;
    if (bVar77) {
      SVar9 = (x->content_state_sb).source_sad_nonrd;
      if (bVar76) {
        psVar31 = (scale_factors *)0x0;
      }
      else {
        iVar53 = (cpi->common).remapped_ref_idx[0];
        psVar31 = (scale_factors *)0x0;
        if (iVar53 != -1) {
          psVar31 = (cpi->common).ref_scale_factors + iVar53;
        }
      }
      av1_setup_pre_planes(xd,0,pYVar27,mi_row,mi_col,psVar31,iVar45);
      pMVar12->ref_frame[0] = '\x01';
      pMVar12->ref_frame[1] = -1;
      pMVar12->bsize = ((cpi->common).seq_params)->sb_size;
      pMVar12->mv[0].as_int = 0;
      (pMVar12->interp_filters).as_int = 0x30003;
      iVar53 = (cpi->sf).rt_sf.estimate_motion_for_var_based_partition;
      iVar24 = 2;
      if ((int)SVar9 < 4) {
        iVar24 = iVar53;
      }
      if (iVar53 < 3) {
        iVar24 = iVar53;
      }
      if (((iVar24 - 1U < 2) && (-1 < (x->e_mbd).mb_to_right_edge)) &&
         ((-1 < (x->e_mbd).mb_to_bottom_edge && (2 < (int)SVar9 && 100 < x->source_variance)))) {
        aVar7 = (cpi->oxcf).tune_cfg.content;
        uVar46 = 0x60;
        if ((3 < (int)SVar9) && ((cpi->rc).high_motion_content_screen_rtc == 0)) {
          if ((cpi->svc).temporal_layer_id == 0) {
            uVar46 = 0x200;
          }
          else {
            uVar46 = 0x60;
            if (2 < (cpi->rc).num_col_blscroll_last_tl0) {
              uVar46 = 0x200;
            }
          }
        }
        if (aVar7 == AOM_CONTENT_SCREEN) {
          uVar72 = 0xc0;
          if (3 < (int)SVar9) {
            uVar72 = 0x200;
          }
          BVar42 = ((cpi->common).seq_params)->sb_size;
        }
        else {
          BVar42 = ((cpi->common).seq_params)->sb_size;
          uVar46 = (uint)(block_size_wide[BVar42] >> 1);
          uVar72 = (uint)(block_size_high[BVar42] >> 1);
        }
        pMVar11 = *(x->e_mbd).mi;
        uVar46 = av1_int_pro_motion_estimation
                           (cpi,x,BVar42,mi_row,mi_col,&kZeroMv,(uint *)avg_16x16,uVar46,uVar72);
        if (aVar7 == AOM_CONTENT_SCREEN) {
          if ((uint)avg_16x16[0][0] >> 1 <= uVar46) {
LAB_00222ef3:
            x->sb_me_partition = 0;
            pMVar11->mv[0].as_int = 0;
            uVar46 = avg_16x16[0][0];
            goto LAB_00222f07;
          }
          uVar72 = 20000;
          if (((cpi->common).seq_params)->sb_size == BLOCK_128X128) {
            uVar72 = 50000;
          }
          if (uVar72 <= uVar46) goto LAB_00222ef3;
          x->sb_me_partition = 1;
          x->sb_me_mv = pMVar11->mv[0];
          if ((cpi->svc).temporal_layer_id == 0) {
            uVar4 = pMVar11->mv[0].as_mv.row;
            uVar5 = pMVar11->mv[0].as_mv.col;
            uVar43 = -uVar5;
            if (0 < (short)uVar5) {
              uVar43 = uVar5;
            }
            if (uVar4 == 0 && 0x10 < uVar43) {
              x->sb_col_scroll = 1;
            }
            else {
              uVar43 = -uVar4;
              if (0 < (short)uVar4) {
                uVar43 = uVar4;
              }
              if ((uVar5 == 0) && (0x10 < uVar43)) {
                x->sb_row_scroll = 1;
              }
            }
          }
        }
        else {
LAB_00222f07:
          if (uVar46 == 0xffffffff) goto LAB_00222f0c;
        }
      }
      else {
LAB_00222f0c:
        uVar46 = (*cpi->ppi->fn_ptr[bsize].sdf)
                           (x->plane[0].src.buf,x->plane[0].src.stride,
                            (x->e_mbd).plane[0].pre[0].buf,(x->e_mbd).plane[0].pre[0].stride);
      }
      if ((1 < iVar24) &&
         (((_Var14 = (x->e_mbd).up_available, _Var14 != false || ((x->e_mbd).left_available == true)
           ) && (SVar9 = (x->content_state_sb).source_sad_nonrd, iVar24 == 2 || (int)SVar9 < 4)))) {
        iVar53 = (x->mv_limits).col_min << 3;
        if (iVar53 < -0x1ff7) {
          iVar53 = -0x1ff8;
        }
        iVar52 = (x->mv_limits).col_max << 3;
        if (0x1ff7 < iVar52) {
          iVar52 = 0x1ff8;
        }
        iVar66 = (x->mv_limits).row_min << 3;
        if (iVar66 < -0x1ff7) {
          iVar66 = -0x1ff8;
        }
        iVar49 = (x->mv_limits).row_max << 3;
        if (0x1ff7 < iVar49) {
          iVar49 = 0x1ff8;
        }
        if (iVar52 < iVar53) {
          iVar52 = iVar53;
        }
        if (iVar49 < iVar66) {
          iVar49 = iVar66;
        }
        if (0x3ffe < iVar52) {
          iVar52 = 0x3fff;
        }
        if (0x3ffe < iVar49) {
          iVar49 = 0x3fff;
        }
        subpel_mv = (*(x->e_mbd).mi)->mv;
        avg_16x16[0][0] = iVar53;
        avg_16x16[0][1] = iVar52;
        avg_16x16[0][2] = iVar66;
        avg_16x16[0][3] = iVar49;
        FVar18 = get_fullmv_from_mv(&subpel_mv->as_mv);
        FVar20.row = 0;
        FVar20.col = 0;
        uVar38 = 0;
        uVar72 = 0xffffffff;
        if (_Var14 != false) {
          pMVar11 = (x->e_mbd).above_mbmi;
          if ((pMVar11->mode < 0xd) || (pMVar11->ref_frame[0] != '\x01')) {
            FVar20.row = 0;
            FVar20.col = 0;
            uVar38 = 0;
            uVar72 = 0xffffffff;
          }
          else {
            iVar37 = (int)pMVar11->mv[0].as_mv.row;
            iVar19 = (int)pMVar11->mv[0].as_mv >> 0x10;
            iVar21 = iVar52;
            if (iVar19 < iVar52) {
              iVar21 = iVar19;
            }
            maxvar_16x16[0][0]._2_2_ = (short)iVar21;
            if (iVar19 < iVar53) {
              maxvar_16x16[0][0]._2_2_ = (short)iVar53;
            }
            iVar21 = iVar49;
            if (iVar37 < iVar49) {
              iVar21 = iVar37;
            }
            maxvar_16x16[0][0]._0_2_ = (short)iVar21;
            if (iVar37 < iVar66) {
              maxvar_16x16[0][0]._0_2_ = (short)iVar66;
            }
            FVar20 = get_fullmv_from_mv((MV *)maxvar_16x16);
            uVar38 = (uint)FVar20 >> 0x10;
            uVar54 = (int)FVar18.row - (int)FVar20.row;
            uVar72 = -uVar54;
            if (0 < (int)uVar54) {
              uVar72 = uVar54;
            }
            iVar19 = ((int)FVar18 >> 0x10) - ((int)FVar20 >> 0x10);
            iVar21 = -iVar19;
            if (0 < iVar19) {
              iVar21 = iVar19;
            }
            if (iVar21 == 0 && (uVar72 & 0xffff) == 0) {
              uVar72 = 0xffffffff;
            }
            else {
              iVar21 = (x->e_mbd).plane[0].pre[0].stride;
              uVar72 = (*cpi->ppi->fn_ptr[bsize].sdf)
                                 (x->plane[0].src.buf,x->plane[0].src.stride,
                                  (x->e_mbd).plane[0].pre[0].buf +
                                  (FVar20.row * iVar21 + ((int)FVar20 >> 0x10)),iVar21);
            }
          }
        }
        uVar54 = 0xffffffff;
        uVar59 = 0;
        iVar24 = 8 - (uint)(2 < (int)SVar9 && iVar24 != 2);
        if (((x->e_mbd).left_available == true) &&
           (pMVar11 = (x->e_mbd).left_mbmi, 0xc < pMVar11->mode)) {
          uVar62 = 0;
          if (pMVar11->ref_frame[0] == '\x01') {
            iVar19 = (int)pMVar11->mv[0].as_mv.row;
            iVar21 = (int)pMVar11->mv[0].as_mv >> 0x10;
            if (iVar21 < iVar52) {
              iVar52 = iVar21;
            }
            maxvar_16x16[0][0]._2_2_ = (short)iVar52;
            if (iVar21 < iVar53) {
              maxvar_16x16[0][0]._2_2_ = (short)iVar53;
            }
            if (iVar19 < iVar49) {
              iVar49 = iVar19;
            }
            maxvar_16x16[0][0]._0_2_ = (short)iVar49;
            if (iVar19 < iVar66) {
              maxvar_16x16[0][0]._0_2_ = (short)iVar66;
            }
            FVar22 = get_fullmv_from_mv((MV *)maxvar_16x16);
            iVar53 = (int)FVar22.row;
            uVar54 = FVar18.row - iVar53;
            uVar59 = -uVar54;
            if (0 < (int)uVar54) {
              uVar59 = uVar54;
            }
            iVar66 = (int)FVar22 >> 0x10;
            iVar49 = ((int)FVar18 >> 0x10) - iVar66;
            iVar52 = -iVar49;
            if (0 < iVar49) {
              iVar52 = iVar49;
            }
            uVar54 = 0xffffffff;
            if (iVar52 != 0 || (uVar59 & 0xffff) != 0) {
              local_308 = FVar20.row;
              iVar49 = local_308 - iVar53;
              iVar52 = -iVar49;
              if (0 < iVar49) {
                iVar52 = iVar49;
              }
              local_278 = (short)uVar38;
              iVar21 = local_278 - iVar66;
              iVar49 = -iVar21;
              if (0 < iVar21) {
                iVar49 = iVar21;
              }
              if (iVar49 != 0 || iVar52 != 0) {
                iVar52 = (x->e_mbd).plane[0].pre[0].stride;
                uVar54 = (*cpi->ppi->fn_ptr[bsize].sdf)
                                   (x->plane[0].src.buf,x->plane[0].src.stride,
                                    (x->e_mbd).plane[0].pre[0].buf + (iVar53 * iVar52 + iVar66),
                                    iVar52);
              }
            }
            uVar62 = (int)FVar22 << 3 & 0xfff80000;
            uVar59 = (int)FVar22 << 3 & 0xffff;
          }
        }
        else {
          uVar62 = 0;
        }
        uVar44 = iVar24 * uVar46 >> 3;
        if ((uVar72 < uVar44) && (uVar72 < uVar54)) {
          subpel_mv->as_int = uVar38 * 0x80000 + ((uint)FVar20 & 0x1fff) * 8;
          clamp_mv(&subpel_mv->as_mv,(SubpelMvLimits *)avg_16x16);
          uVar44 = iVar24 * uVar72 >> 3;
          uVar46 = uVar72;
        }
        if ((uVar54 < uVar44) && (uVar54 < uVar72)) {
          subpel_mv->as_int = uVar62 | uVar59;
          clamp_mv(&subpel_mv->as_mv,(SubpelMvLimits *)avg_16x16);
          uVar46 = uVar54;
        }
      }
    }
    dVar13 = (double)uVar46 * 0.9;
    if (dVar13 <= (double)uVar17) {
      if ((uVar17 <= uVar25) || (dVar13 <= (double)uVar60)) goto LAB_00223501;
LAB_002233fa:
      iVar53 = (cpi->common).remapped_ref_idx[6];
      psVar31 = (scale_factors *)0x0;
      if (iVar53 != -1) {
        psVar31 = (cpi->common).ref_scale_factors + iVar53;
      }
      av1_setup_pre_planes(xd,0,pYVar30,mi_row,mi_col,psVar31,iVar45);
      pMVar12->ref_frame[0] = '\a';
      pMVar12->mv[0].as_int = 0;
      x->nonrd_prune_ref_frame_search = 0;
      x->sb_me_partition = 0;
      local_322 = '\a';
      local_2b0 = uVar60;
    }
    else {
      if (dVar13 <= (double)uVar60) {
        if (uVar17 < uVar25) goto LAB_0022347f;
      }
      else {
        if (uVar17 < uVar25) {
LAB_0022347f:
          iVar53 = (cpi->common).remapped_ref_idx[3];
          psVar31 = (scale_factors *)0x0;
          if (iVar53 != -1) {
            psVar31 = (cpi->common).ref_scale_factors + iVar53;
          }
          av1_setup_pre_planes(xd,0,pYVar29,mi_row,mi_col,psVar31,iVar45);
          pMVar12->ref_frame[0] = '\x04';
          pMVar12->mv[0].as_int = 0;
          x->nonrd_prune_ref_frame_search = 0;
          x->sb_me_partition = 0;
          local_322 = '\x04';
          local_2b0 = (ulong)uVar17;
          goto LAB_00223520;
        }
        if (uVar17 >= uVar25 && uVar17 != uVar25) goto LAB_002233fa;
      }
LAB_00223501:
      x->nonrd_prune_ref_frame_search = (cpi->sf).rt_sf.nonrd_prune_ref_frame_search;
      local_322 = '\x01';
      local_2b0 = (ulong)uVar46;
    }
LAB_00223520:
    sVar48 = 1;
    if (pMVar12->mv[0].as_int != 0) {
      cm = &cpi->common;
      if (bVar76) {
        psVar31 = &sf_no_scale;
        (x->e_mbd).block_ref_scale_factors[0] = psVar31;
      }
      else {
        uVar6 = pMVar12->ref_frame[0];
        cVar16 = pMVar12->ref_frame[1];
        ref_frame = uVar6;
        if ((char)uVar6 < '\x02') {
          ref_frame = '\x01';
        }
        psVar31 = get_ref_scale_factors_const(cm,ref_frame);
        (x->e_mbd).block_ref_scale_factors[0] = psVar31;
        if (cVar16 < '\x02') {
          cVar16 = '\x01';
        }
        psVar31 = get_ref_scale_factors_const(cm,cVar16);
      }
      (x->e_mbd).block_ref_scale_factors[1] = psVar31;
      av1_enc_build_inter_predictor
                (cm,xd,mi_row,mi_col,(BUFFER_SET *)0x0,((cpi->common).seq_params)->sb_size,0,iVar63)
      ;
    }
    pMVar12 = *(x->e_mbd).mi;
    uVar8 = pMVar12->mv[0].as_int;
    uVar41 = (ulong)(uVar8 == 0);
    local_2a0 = (x->e_mbd).plane[0].pre[uVar41 - 1].buf;
    iVar63 = (x->e_mbd).plane[0].pre[uVar41 - 1].stride;
    uv_sad[0] = 0;
    uv_sad[1] = 0;
    if ((cpi->oxcf).tool_cfg.enable_monochrome == false) {
      SVar9 = (x->content_state_sb).source_sad_nonrd;
      if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) {
        if ((cpi->rc).high_source_sad == 0) {
          if ((cpi->rc).percent_blocks_with_motion < 0x5b) {
            uVar72 = 6;
          }
          else {
            uVar72 = 6;
            if (10000 < (cpi->rc).frame_source_sad && 2 < (int)SVar9) {
              bVar15 = 8;
              sVar48 = 3;
              goto LAB_00223677;
            }
          }
          goto LAB_002236a6;
        }
        bVar15 = 7;
        sVar48 = 1;
LAB_00223677:
        uVar72 = 6;
      }
      else {
        uVar72 = (uint)((cpi->common).height * (cpi->common).width < 0x1fa400) * 2 + 3;
LAB_002236a6:
        bVar15 = 3;
        if (((2 < (int)SVar9) && (500 < x->source_variance)) &&
           (0x383ff < (cpi->common).height * (cpi->common).width)) {
          sVar48 = 2;
          bVar15 = SVar9 == kMedSad ^ 5;
        }
      }
      iVar45 = (cpi->common).remapped_ref_idx[0];
      if (iVar45 == -1) {
        pRVar28 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar28 = (cpi->common).ref_frame_map[iVar45];
      }
      pYVar27 = &pRVar28->buf;
      if (pRVar28 == (RefCntBuffer *)0x0) {
        pYVar27 = (YV12_BUFFER_CONFIG *)0x0;
      }
      lVar26 = (long)(cpi->common).remapped_ref_idx[3];
      if (lVar26 == -1) {
        pRVar28 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar28 = (cpi->common).ref_frame_map[lVar26];
      }
      pYVar29 = &pRVar28->buf;
      if (pRVar28 == (RefCntBuffer *)0x0) {
        pYVar29 = (YV12_BUFFER_CONFIG *)0x0;
      }
      lVar26 = (long)(cpi->common).remapped_ref_idx[6];
      psVar31 = (scale_factors *)0x0;
      if (lVar26 == -1) {
        pRVar28 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar28 = (cpi->common).ref_frame_map[lVar26];
      }
      pYVar30 = &pRVar28->buf;
      if (pRVar28 == (RefCntBuffer *)0x0) {
        pYVar30 = (YV12_BUFFER_CONFIG *)0x0;
      }
      scale = (cpi->common).ref_scale_factors + iVar45;
      if (iVar45 == -1) {
        scale = psVar31;
      }
      piVar35 = &(x->e_mbd).plane[1].subsampling_x;
      pbVar73 = &x->plane[1].src;
      uVar38 = 0;
      for (lVar26 = 0; lVar26 != 2; lVar26 = lVar26 + 1) {
        uVar41 = (ulong)av1_ss_size_lookup[bsize][*piVar35][piVar35[1]];
        if (uVar41 != 0xff) {
          if (uVar8 == 0) {
            if (pMVar12->ref_frame[0] == '\x01') {
              pAVar32 = cpi->ppi;
              puVar55 = pbVar73->buf;
              iVar45 = pbVar73->stride;
              puVar61 = ((buf_2d *)(piVar35 + 0xb))->buf;
              iVar53 = piVar35[0x11];
            }
            else {
              setup_pred_plane((buf_2d *)avg_16x16,(*(x->e_mbd).mi)->bsize,
                               pYVar27->store_buf_adr[(ulong)(lVar26 != 0) - 3],
                               (pYVar27->field_2).field_0.uv_crop_width,
                               (pYVar27->field_3).field_0.uv_crop_height,
                               (pYVar27->field_4).field_0.uv_stride,(x->e_mbd).mi_row,
                               (x->e_mbd).mi_col,scale,*piVar35,piVar35[1]);
              pAVar32 = cpi->ppi;
              puVar55 = pbVar73->buf;
              iVar45 = pbVar73->stride;
              puVar61 = (uint8_t *)CONCAT44(avg_16x16[0][1],avg_16x16[0][0]);
              iVar53 = avg_16x16[1][2];
            }
          }
          else {
            pAVar32 = cpi->ppi;
            puVar55 = pbVar73->buf;
            iVar45 = pbVar73->stride;
            puVar61 = ((buf_2d *)(piVar35 + 3))->buf;
            iVar53 = piVar35[9];
          }
          uVar54 = (*pAVar32->fn_ptr[uVar41].sdf)(puVar55,iVar45,puVar61,iVar53);
          uv_sad[lVar26] = uVar54;
          if (uVar17 != 0xffffffff) {
            setup_pred_plane((buf_2d *)avg_16x16,(*(x->e_mbd).mi)->bsize,
                             pYVar29->store_buf_adr[(ulong)(lVar26 != 0) - 3],
                             (pYVar29->field_2).field_0.uv_crop_width,
                             (pYVar29->field_3).field_0.uv_crop_height,
                             (pYVar29->field_4).field_0.uv_stride,(x->e_mbd).mi_row,
                             (x->e_mbd).mi_col,scale,*piVar35,piVar35[1]);
            uVar38 = (*cpi->ppi->fn_ptr[uVar41].sdf)
                               (pbVar73->buf,pbVar73->stride,
                                (uint8_t *)CONCAT44(avg_16x16[0][1],avg_16x16[0][0]),avg_16x16[1][2]
                               );
          }
          if (uVar25 != 0xffffffff) {
            setup_pred_plane((buf_2d *)avg_16x16,(*(x->e_mbd).mi)->bsize,
                             pYVar30->store_buf_adr[(ulong)(lVar26 != 0) - 3],
                             (pYVar30->field_2).field_0.uv_crop_width,
                             (pYVar30->field_3).field_0.uv_crop_height,
                             (pYVar30->field_4).field_0.uv_stride,(x->e_mbd).mi_row,
                             (x->e_mbd).mi_col,scale,*piVar35,piVar35[1]);
            uVar54 = (*cpi->ppi->fn_ptr[uVar41].sdf)
                               (pbVar73->buf,pbVar73->stride,
                                (uint8_t *)CONCAT44(avg_16x16[0][1],avg_16x16[0][0]),avg_16x16[1][2]
                               );
            psVar31 = (scale_factors *)(ulong)uVar54;
          }
        }
        if (uVar46 >> sVar48 < uv_sad[lVar26]) {
          x->color_sensitivity_sb[lVar26] = '\x01';
        }
        else if (uv_sad[lVar26] < uVar46 >> bVar15) {
          x->color_sensitivity_sb[lVar26] = '\0';
        }
        else {
          x->color_sensitivity_sb[lVar26] = '\x02';
        }
        x->color_sensitivity_sb_g[lVar26] = uVar17 / uVar72 < uVar38;
        x->color_sensitivity_sb_alt[lVar26] = (uint)(uVar60 / uVar72) < (uint)psVar31;
        piVar35 = piVar35 + 0x28c;
        pbVar73 = (buf_2d *)((long)(pbVar73 + 4) + 8);
      }
    }
    uVar17 = (uint)local_2b0;
  }
  x->force_zeromv_skip_for_sb = 0;
  v = (VPartVar *)aom_malloc(0x58);
  if (v == (VPartVar *)0x0) {
    aom_internal_error((x->e_mbd).error_info,AOM_CODEC_MEM_ERROR,"Failed to allocate vt");
  }
  *(VP64x64 **)(v + 5) = td->vt64x64;
  if (((((bVar78 == false) && (iVar45 = (cpi->sf).rt_sf.part_early_exit_zeromv, iVar45 != 0)) &&
       ((local_322 == '\x01' &&
        ((0x1e < (cpi->rc).frames_since_key && (local_250 = (short)uVar51, local_250 == 0)))))) &&
      ((*(x->e_mbd).mi)->mv[0].as_int == 0)) &&
     (iVar53 = (cpi->sf).rt_sf.set_zeromv_skip_based_on_source_sad, iVar53 != 0)) {
    SVar9 = (x->content_state_sb).source_sad_nonrd;
    if (iVar53 < 3) {
      if (iVar53 == 2) {
        if (SVar9 < kLowSad) {
LAB_0022523c:
          BVar42 = ((cpi->common).seq_params)->sb_size;
          if ((int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [BVar42] + mi_col) <= tile->mi_col_end) {
            bVar76 = (cpi->sf).rt_sf.increase_source_sad_thresh != 0;
            uVar46 = cpi->zeromv_skip_thresh_exit_part[bsize] << bVar76;
            uVar25 = (uVar46 * 3 >> 2) << bVar76;
            uVar51 = uVar25 >> 3;
            if (iVar45 != 1) {
              uVar51 = uVar25;
            }
            if (SVar9 == kZeroSad) {
              uVar51 = uVar25;
            }
            if (((((int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [BVar42] + mi_row) <= tile->mi_row_end) && (uVar17 < uVar46)) &&
                (uv_sad[0] < uVar51)) && (uv_sad[1] < uVar51)) {
              set_block_size(cpi,mi_row,mi_col,bsize);
              x->force_zeromv_skip_for_sb = 1;
              goto LAB_00224e53;
            }
          }
          if (1 < iVar45 && SVar9 == kZeroSad) {
            x->force_zeromv_skip_for_sb = 2;
          }
        }
      }
      else if (SVar9 == kZeroSad && 0 < iVar53) goto LAB_0022523c;
    }
    else if (SVar9 < kMedSad) goto LAB_0022523c;
  }
  if ((cpi->noise_estimate).enabled == 0) {
    bVar76 = false;
  }
  else {
    NVar23 = av1_noise_estimate_extract_level(&cpi->noise_estimate);
    bVar76 = kLow < NVar23;
  }
  puVar55 = (x->part_search_info).variance_low;
  iVar24 = (uint)(BVar2 != BLOCK_64X64) * 0x40;
  iVar45 = (x->e_mbd).mb_to_right_edge;
  iVar53 = (x->e_mbd).mb_to_bottom_edge;
  iVar52 = (iVar45 >> 0x1f & iVar45 >> 3) + iVar24 + 0x40;
  iVar45 = (iVar53 >> 0x1f & iVar53 >> 3) + iVar24 + 0x40;
  uVar51 = (uint)(byte)(~bVar78 & (cpi->sf).rt_sf.use_rtc_tf != 0);
  local_1d8 = 0xf8;
  local_1e0 = 0x148;
  lVar26 = 0;
  while (threshold_01 = iStack_1f0, threshold_00 = local_1f8, threshold = iStack_200,
        lVar26 != (ulong)(BVar2 != BLOCK_64X64) * 3 + 1) {
    local_1c0 = lVar26 + 1;
    local_148[lVar26 + 1] = '\0';
    lVar47 = lVar26 * 4 + -0x143;
    local_1c8 = local_1e0;
    local_1d0 = local_1d8;
    for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
      piVar35 = avg_16x16[lVar26] + lVar39;
      *piVar35 = 0;
      piVar58 = maxvar_16x16[lVar26] + lVar39;
      *piVar58 = 0;
      local_143[lVar39 + lVar47 + 0x143] = '\0';
      piVar1 = minvar_16x16[lVar26] + lVar39;
      *piVar1 = 0x7fffffff;
      lVar40 = (lVar26 * 4 + lVar39) * 4 + -0x133;
      local_2a8 = local_1c8;
      local_270 = local_1d0;
      for (lVar74 = 0; lVar74 != 4; lVar74 = lVar74 + 1) {
        uVar46 = ((uint)lVar74 & 1) << 4 | ((uint)lVar39 & 1) << 5 | ((uint)lVar26 & 1) << 6;
        uVar17 = (((uint)lVar39 & 2) << 4 | ((uint)lVar26 & 0x7fffffe) << 5) +
                 ((uint)lVar74 & 2) * 8;
        lVar33 = *(long *)(v + 5);
        *(undefined1 *)((long)local_e8 + lVar74 + lVar40 + 0xe8) = 0;
        if (bVar78 == false) {
          if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
            sse[0] = 0;
            sse[1] = 0;
            sse[2] = 0;
            sse[3] = 0;
            sum[0] = 0;
            sum[1] = 0;
            sum[2] = 0;
            sum[3] = 0;
            uVar25 = 0;
            bVar77 = true;
            for (uVar72 = 0; uVar72 != 0x10; uVar72 = uVar72 + 4) {
              bVar77 = (bool)(bVar77 & ((int)(uVar72 & 8 | uVar17) < iVar45 &&
                                       (int)(uVar25 & 8 | uVar46) < iVar52));
              uVar25 = uVar25 + 8;
            }
            if (bVar77) {
              (*aom_avg_8x8_quad)(puVar70,iVar56,uVar46,uVar17,src_avg);
              (*aom_avg_8x8_quad)(local_2a0,iVar63,uVar46,uVar17,local_e8);
              for (lVar50 = 0; lVar50 != 4; lVar50 = lVar50 + 1) {
                iVar53 = src_avg[lVar50] - local_e8[lVar50];
                sum[lVar50] = iVar53;
                sse[lVar50] = iVar53 * iVar53;
              }
            }
            else {
              uVar25 = 0;
              for (lVar50 = 0; lVar50 != 0x10; lVar50 = lVar50 + 4) {
                uVar72 = uVar25 & 8 | uVar46;
                if (((int)uVar72 < iVar52) &&
                   (uVar38 = (uint)lVar50 & 8 | uVar17, (int)uVar38 < iVar45)) {
                  uVar54 = aom_avg_8x8_sse2(puVar70 + (long)(int)(uVar38 * iVar56) + (ulong)uVar72,
                                            iVar56);
                  uVar72 = aom_avg_8x8_sse2(local_2a0 + (long)(int)(uVar38 * iVar63) + (ulong)uVar72
                                            ,iVar63);
                  iVar53 = uVar54 - uVar72;
                  *(int *)((long)sum + lVar50) = iVar53;
                  *(int *)((long)sse + lVar50) = iVar53 * iVar53;
                }
                uVar25 = uVar25 + 8;
              }
            }
            puVar67 = (undefined4 *)(local_270 + lVar33);
            for (lVar50 = 0; lVar50 != 4; lVar50 = lVar50 + 1) {
              iVar53 = sum[lVar50];
              puVar67[-2] = sse[lVar50];
              puVar67[-1] = iVar53;
              *puVar67 = 0;
              puVar67 = puVar67 + 0xa4;
            }
          }
          else {
            puVar67 = (undefined4 *)(local_270 + lVar33);
            uVar25 = 0;
            for (lVar50 = 0; lVar50 != 0x10; lVar50 = lVar50 + 4) {
              uVar72 = uVar25 & 8 | uVar46;
              iVar53 = 0;
              if ((int)uVar72 < iVar52) {
                uVar38 = (uint)lVar50 & 8 | uVar17;
                iVar24 = 0;
                if ((int)uVar38 < iVar45) {
                  uVar54 = aom_highbd_avg_8x8_c
                                     (puVar70 + (long)(int)(uVar38 * iVar56) + (ulong)uVar72,iVar56)
                  ;
                  uVar72 = aom_highbd_avg_8x8_c
                                     (local_2a0 + (long)(int)(uVar38 * iVar63) + (ulong)uVar72,
                                      iVar63);
                  iVar53 = uVar54 - uVar72;
                  iVar24 = iVar53 * iVar53;
                }
              }
              else {
                iVar24 = 0;
              }
              puVar67[-2] = iVar24;
              puVar67[-1] = iVar53;
              *puVar67 = 0;
              puVar67 = puVar67 + 0xa4;
              uVar25 = uVar25 + 8;
            }
          }
          fill_variance_tree((void *)(lVar74 * 0xa90 + lVar33 + lVar26 * 0xaa90 + lVar39 * 0x2a90 +
                                     0xa0),BLOCK_16X16);
          lVar33 = lVar26 * 0xaa90 + *(long *)(v + 5) + lVar39 * 0x2a90 + lVar74 * 0xa90;
          get_variance((VPartVar *)(lVar33 + 0xa0));
          iVar53 = *(int *)(lVar33 + 0xac);
          *piVar35 = *piVar35 + iVar53;
          iVar24 = *piVar1;
          if (iVar53 <= *piVar1) {
            iVar24 = iVar53;
          }
          iVar66 = *piVar58;
          if (*piVar58 <= iVar53) {
            iVar66 = iVar53;
          }
          *piVar1 = iVar24;
          *piVar58 = iVar66;
          if (iStack_1f0 < iVar53) {
            *(undefined1 *)((long)local_e8 + lVar74 + lVar40 + 0xe8) = 1;
            local_143[lVar39 + lVar47 + 0x143] = '\x01';
            local_148[local_1c0] = '\x01';
            local_148[0] = '\x01';
          }
        }
        else {
          puVar67 = (undefined4 *)(lVar33 + local_2a8);
          for (lVar33 = 0; lVar33 != 4; lVar33 = lVar33 + 1) {
            uVar25 = ((x->e_mbd).cur_buf)->flags;
            uVar72 = 0;
            puVar68 = puVar67;
            for (lVar50 = 0; lVar50 != 8; lVar50 = lVar50 + 2) {
              uVar38 = uVar72 & 4 | (int)lVar33 * 8 & 8U | uVar46;
              iVar53 = 0;
              if ((int)uVar38 < (int)(iVar52 + uVar51 * -4)) {
                uVar54 = (uint)lVar50 & 4 | (int)lVar33 * 4 & 8U | uVar17;
                iVar24 = 0;
                if ((int)uVar54 < (int)(iVar45 + uVar51 * -4)) {
                  if ((uVar25 & 8) == 0) {
                    uVar38 = aom_avg_4x4_sse2(puVar70 + (long)(int)(uVar54 * iVar56) + (ulong)uVar38
                                              ,iVar56);
                  }
                  else {
                    uVar38 = aom_highbd_avg_4x4_c
                                       (puVar70 + (long)(int)(uVar54 * iVar56) + (ulong)uVar38,
                                        iVar56);
                  }
                  iVar24 = uVar38 - 0x80;
                  iVar53 = iVar24 * iVar24;
                }
              }
              else {
                iVar24 = 0;
              }
              puVar68[-2] = iVar53;
              puVar68[-1] = iVar24;
              *puVar68 = 0;
              puVar68 = puVar68 + 0x24;
              uVar72 = uVar72 + 4;
            }
            puVar67 = puVar67 + 0xa4;
          }
        }
        local_270 = local_270 + 0xa90;
        local_2a8 = local_2a8 + 0xa90;
      }
      local_1d0 = local_1d0 + 0x2a90;
      local_1c8 = local_1c8 + 0x2a90;
    }
    local_1d8 = local_1d8 + 0xaa90;
    local_1e0 = local_1e0 + 0xaa90;
    lVar26 = local_1c0;
  }
  lVar26 = iStack_1f0 * 4;
  lVar40 = local_1f8 >> 1;
  lVar50 = local_1f8 >> 4;
  lVar74 = iStack_200 >> 1;
  lVar33 = iStack_200 >> 3;
  lVar39 = (ulong)(BVar2 != BLOCK_64X64) * 3 + 1;
  local_260 = 0x7fffffff;
  local_2b8 = 0xf0;
  uVar51 = 0;
  iVar56 = 0;
  lVar47 = 0;
  force_split = local_148[0];
  while (lVar47 != lVar39) {
    uVar46 = 0;
    uVar17 = 0x7fffffff;
    lVar57 = local_2b8;
    for (uVar60 = 0; uVar60 != 4; uVar60 = uVar60 + 1) {
      lVar34 = lVar47 * 4 + 5 + uVar60;
      lVar69 = lVar57;
      for (lVar75 = 0; lVar75 != 4; lVar75 = lVar75 + 1) {
        if (bVar78 != false) {
          lVar65 = lVar75 * 0xa90 + uVar60 * 0x2a90 + lVar47 * 0xaa90 + *(long *)(v + 5);
          v_01 = (VPartVar *)(lVar65 + 0xa0);
          v_00 = (VPartVar *)(*(long *)(v + 5) + lVar69);
          for (lVar64 = 0; lVar64 != 0xa40; lVar64 = lVar64 + 0x290) {
            fill_variance_tree((void *)((long)&v_00->sum_square_error + lVar64),BLOCK_8X8);
          }
          fill_variance_tree(v_01,BLOCK_16X16);
          get_variance(v_01);
          if (threshold_01 < *(int *)(lVar65 + 0xac)) {
            cVar16 = '\x01';
            if ((cpi->sf).rt_sf.vbp_prune_16x16_split_using_min_max_sub_blk_var == true) {
              iVar63 = 0;
              iVar45 = 0x7fffffff;
              lVar65 = 4;
              while (bVar77 = lVar65 != 0, lVar65 = lVar65 + -1, bVar77) {
                get_variance(v_00);
                iVar53 = v_00->variance;
                if (iVar63 < iVar53) {
                  iVar63 = iVar53;
                }
                if (iVar53 < iVar45) {
                  iVar45 = iVar53;
                }
                v_00 = v_00 + 0x29;
              }
              cVar16 = '\x02' - (lVar26 < iVar63 - iVar45);
            }
            *(char *)((long)local_e8 + (uVar60 | lVar47 * 4) * 4 + lVar75 + -0x4b) = cVar16;
            local_143[lVar34 + -5] = '\x01';
            force_split = '\x01';
            local_148[lVar47 + 1] = '\x01';
          }
        }
        lVar69 = lVar69 + 0xa90;
      }
      lVar75 = lVar47 * 0xaa90;
      lVar69 = uVar60 * 0x2a90;
      fill_variance_tree((void *)(*(long *)(v + 5) + lVar75 + lVar69 + 0x50),BLOCK_32X32);
      iVar63 = (cpi->common).height;
      iVar45 = (cpi->common).width;
      uVar41 = 20000;
      if ((2 < (cpi->svc).number_temporal_layers) && ((cpi->svc).temporal_layer_id == 0)) {
        uVar41 = 40000;
      }
      if (local_143[lVar34 + -5] == '\0') {
        get_variance((VPartVar *)(*(long *)(v + 5) + lVar75 + lVar69 + 0x50));
        uVar25 = *(uint *)(lVar69 + 0x5c + lVar75 + *(long *)(v + 5));
        if ((int)uVar46 < (int)uVar25) {
          uVar46 = uVar25;
        }
        if ((int)uVar25 < (int)uVar17) {
          uVar17 = uVar25;
        }
        if (threshold_00 < (int)uVar25) {
LAB_0022467d:
          local_143[lVar34 + -5] = '\x01';
          force_split = '\x01';
          local_148[lVar47 + 1] = '\x01';
        }
        else if (bVar78 == false) {
          iVar53 = maxvar_16x16[lVar47][uVar60];
          lVar69 = (long)iVar53;
          iVar24 = minvar_16x16[lVar47][uVar60];
          if (((lVar40 < (int)uVar25) && (avg_16x16[lVar47][uVar60] >> 1 < (int)uVar25)) ||
             ((iVar63 * iVar45 < 0x38401 &&
              ((lVar40 < lVar69 - iVar24 && threshold_00 < lVar69 ||
               (((((cpi->sf).rt_sf.prefer_large_partition_blocks != 0 &&
                  (kLowSad < (x->content_state_sb).source_sad_nonrd)) &&
                 ((cpi->rc).frame_source_sad < uVar41)) &&
                ((lVar50 < lVar69 &&
                 (iVar53 != iVar24 * 4 && SBORROW4(iVar53,iVar24 * 4) == iVar53 + iVar24 * -4 < 0)))
                ))))))) goto LAB_0022467d;
        }
      }
      lVar57 = lVar57 + 0x2a90;
    }
    if (local_148[lVar47 + 1] == '\0') {
      lVar57 = lVar47 * 0xaa90;
      fill_variance_tree((void *)(*(long *)(v + 5) + lVar57),BLOCK_64X64);
      get_variance((VPartVar *)(*(long *)(v + 5) + lVar57));
      uVar25 = *(uint *)(*(long *)(v + 5) + 0xc + lVar57);
      if ((int)uVar51 < (int)uVar25) {
        uVar51 = uVar25;
      }
      if ((int)uVar25 < (int)local_260) {
        local_260 = uVar25;
      }
      if ((bVar76) || (cpi->ppi->use_svc != 0)) {
        bVar77 = false;
      }
      else {
        bVar77 = (cpi->sf).rt_sf.prefer_large_partition_blocks == 0;
      }
      if ((bVar78 == false) &&
         ((lVar74 < (long)(ulong)uVar46 && !bVar77) && lVar33 * 3 < (long)(int)(uVar46 - uVar17))) {
        local_148[lVar47 + 1] = '\x01';
        force_split = '\x01';
      }
      iVar56 = iVar56 + uVar25;
    }
    if (BVar2 == BLOCK_64X64) {
      force_split = '\x01';
    }
    local_2b8 = local_2b8 + 0xaa90;
    lVar47 = lVar47 + 1;
  }
  local_148[0] = force_split;
  if (force_split == '\0') {
    fill_variance_tree(v,BLOCK_128X128);
    get_variance(v);
    if (bVar78 == false) {
      force_split = local_208 >> 1 < (long)(ulong)uVar51 &&
                    (local_208 >> 3) * 3 < (long)(int)(uVar51 - local_260) ||
                    iVar56 * 9 >> 5 < v->variance;
    }
    else {
      force_split = '\0';
    }
  }
  if (((tile->mi_col_end < mi_col + 0x20) || (tile->mi_row_end < mi_row + 0x20)) ||
     (iVar56 = set_vt_partitioning(cpi,xd,tile,v,BLOCK_128X128,mi_row,mi_col,local_208,BLOCK_16X16,
                                   force_split), iVar56 == 0)) {
    lVar26 = 0;
    while (lVar47 = lVar26, lVar47 != lVar39) {
      lVar40 = lVar47 * 0xaa90;
      iVar63 = mi_row + ((uint)lVar47 & 0xfffffffe) * 8;
      iVar45 = ((uint)lVar47 & 1) * 0x10 + mi_col;
      iVar56 = set_vt_partitioning(cpi,xd,tile,(void *)(*(long *)(v + 5) + lVar40),BLOCK_64X64,
                                   iVar63,iVar45,threshold,BLOCK_16X16,local_148[lVar47 + 1]);
      lVar26 = lVar47 + 1;
      if (iVar56 == 0) {
        for (uVar60 = 0; uVar60 != 4; uVar60 = uVar60 + 1) {
          iVar53 = iVar63 + ((uint)uVar60 & 2) * 4;
          iVar24 = iVar45 + ((uint)uVar60 & 1) * 8;
          iVar56 = set_vt_partitioning(cpi,xd,tile,
                                       (void *)(*(long *)(v + 5) + lVar40 + uVar60 * 0x2a90 + 0x50),
                                       BLOCK_32X32,iVar53,iVar24,threshold_00,BLOCK_16X16,
                                       local_143[lVar47 * 4 + uVar60]);
          if (iVar56 == 0) {
            for (lVar74 = 0; lVar74 != 4; lVar74 = lVar74 + 1) {
              iVar52 = iVar53 + ((uint)lVar74 & 2) * 2;
              iVar66 = iVar24 + ((uint)lVar74 & 1) * 4;
              iVar56 = set_vt_partitioning(cpi,xd,tile,
                                           (void *)(*(long *)(v + 5) + lVar40 + uVar60 * 0x2a90 +
                                                    lVar74 * 0xa90 + 0xa0),BLOCK_16X16,iVar52,iVar66
                                           ,threshold_01,BLOCK_8X8,
                                           *(PART_EVAL_STATUS *)
                                            ((long)local_e8 +
                                            (uVar60 | lVar47 * 4) * 4 + lVar74 + -0x4b));
              if (iVar56 == 0) {
                uVar51 = 0;
                for (uVar17 = 0; uVar17 != 4; uVar17 = uVar17 + 1) {
                  set_block_size(cpi,(uVar17 & 2) + iVar52,(uVar51 & 2) + iVar66,BLOCK_8X8);
                  uVar51 = uVar51 + 2;
                }
              }
            }
          }
        }
      }
    }
  }
  if ((local_322 == '\x01') && ((cpi->sf).rt_sf.short_circuit_low_temp_var != 0)) {
    lVar26 = local_208 >> 2;
    if (BVar2 == BLOCK_64X64) {
      lVar47 = *(long *)(v + 5);
      BVar2 = (*(x->e_mbd).mi)->bsize;
      if (BVar2 != BLOCK_64X64) {
        if (BVar2 == BLOCK_64X32) {
          piVar35 = (int *)(lVar47 + 0x1c);
          for (lVar47 = 0; lVar47 != 2; lVar47 = lVar47 + 1) {
            if (*piVar35 < lVar26) {
              *(undefined1 *)((long)(x->thresh_freq_fact + -1) + lVar47 + 0x231) = 1;
            }
            piVar35 = piVar35 + 4;
          }
        }
        else if (BVar2 == BLOCK_32X64) {
          piVar35 = (int *)(lVar47 + 0x3c);
          for (lVar47 = 0; lVar47 != 2; lVar47 = lVar47 + 1) {
            if (*piVar35 < lVar26) {
              *(undefined1 *)((long)(x->thresh_freq_fact + -1) + lVar47 + 0x233) = 1;
            }
            piVar35 = piVar35 + 4;
          }
        }
        else {
          puVar70 = (x->part_search_info).variance_low + 9;
          piVar35 = (int *)(lVar47 + 0xac);
          for (lVar26 = 0; lVar26 != 4; lVar26 = lVar26 + 1) {
            if ((((&DAT_00466cf4)[lVar26 * 2] + mi_col < (cpi->common).mi_params.mi_cols) &&
                ((&set_low_temp_var_flag_128x128_idx32)[lVar26 * 2] + mi_row <
                 (cpi->common).mi_params.mi_rows)) &&
               (pMVar12 = (cpi->common).mi_params.mi_grid_base
                          [(&DAT_00466cf4)[lVar26 * 2] + mi_col +
                           ((&set_low_temp_var_flag_128x128_idx32)[lVar26 * 2] + mi_row) *
                           (cpi->common).mi_params.mi_stride], pMVar12 != (MB_MODE_INFO *)0x0)) {
              BVar2 = pMVar12->bsize;
              if (BVar2 - 6 < 3) {
                piVar58 = piVar35;
                for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
                  if ((long)*piVar58 < threshold_00 >> 8) {
                    puVar70[lVar39] = '\x01';
                  }
                  piVar58 = piVar58 + 0x2a4;
                }
              }
              else if ((BVar2 == BLOCK_32X32) &&
                      ((long)*(int *)(lVar47 + 0x5c + lVar26 * 0x2a90) < threshold * 5 >> 3)) {
                puVar55[lVar26 + 5] = '\x01';
              }
            }
            puVar70 = puVar70 + 4;
            piVar35 = piVar35 + 0xaa4;
          }
        }
        goto LAB_00224e53;
      }
      iVar56 = *(int *)(lVar47 + 0xc);
    }
    else {
      BVar2 = (*(x->e_mbd).mi)->bsize;
      if (BVar2 != BLOCK_128X128) {
        if (BVar2 == BLOCK_128X64) {
          piVar35 = &v[1].variance;
          for (lVar47 = 0; lVar47 != 2; lVar47 = lVar47 + 1) {
            if (*piVar35 < lVar26) {
              *(undefined1 *)((long)(x->thresh_freq_fact + -1) + lVar47 + 0x231) = 1;
            }
            piVar35 = piVar35 + 4;
          }
        }
        else if (BVar2 == BLOCK_64X128) {
          piVar35 = &v[3].variance;
          for (lVar47 = 0; lVar47 != 2; lVar47 = lVar47 + 1) {
            if (*piVar35 < lVar26) {
              *(undefined1 *)((long)(x->thresh_freq_fact + -1) + lVar47 + 0x233) = 1;
            }
            piVar35 = piVar35 + 4;
          }
        }
        else {
          lVar47 = threshold * 5 >> 4;
          puVar70 = (x->part_search_info).variance_low + 0x11;
          puVar61 = (x->part_search_info).variance_low + 9;
          puVar71 = (x->part_search_info).variance_low + 0x29;
          local_290 = 0x3c;
          local_2e8 = 0x1c;
          local_2c0 = 0xac;
          for (lVar26 = 0; lVar26 != 4; lVar26 = lVar26 + 1) {
            iVar56 = (&set_low_temp_var_flag_128x128_idx64)[lVar26 * 2] + mi_row;
            iVar63 = (&DAT_00466cd4)[lVar26 * 2] + mi_col;
            lVar39 = (long)((cpi->common).mi_params.mi_stride * iVar56 + iVar63);
            pMVar12 = (cpi->common).mi_params.mi_grid_base[lVar39];
            if (((pMVar12 != (MB_MODE_INFO *)0x0) && (iVar63 < (cpi->common).mi_params.mi_cols)) &&
               (iVar56 < (cpi->common).mi_params.mi_rows)) {
              BVar2 = pMVar12->bsize;
              if (BVar2 == BLOCK_64X64) {
                if ((long)*(int *)(*(long *)(v + 5) + 0xc + lVar26 * 0xaa90) < threshold * 5 >> 3) {
                  puVar55[lVar26 + 5] = '\x01';
                }
              }
              else if (BVar2 == BLOCK_64X32) {
                lVar39 = local_2e8;
                for (lVar40 = 0; lVar40 != 2; lVar40 = lVar40 + 1) {
                  if (*(int *)(*(long *)(v + 5) + lVar39) < lVar47) {
                    puVar61[lVar40] = '\x01';
                  }
                  lVar39 = lVar39 + 0x10;
                }
              }
              else if (BVar2 == BLOCK_32X64) {
                lVar39 = local_290;
                for (lVar40 = 0; lVar40 != 2; lVar40 = lVar40 + 1) {
                  if (*(int *)(*(long *)(v + 5) + lVar39) < lVar47) {
                    puVar70[lVar40] = '\x01';
                  }
                  lVar39 = lVar39 + 0x10;
                }
              }
              else {
                local_2f8 = local_2c0;
                puVar36 = puVar71;
                for (lVar40 = 0; lVar40 != 4; lVar40 = lVar40 + 1) {
                  pMVar12 = (cpi->common).mi_params.mi_grid_base
                            [lVar39 + ((cpi->common).mi_params.mi_stride *
                                       (&set_low_temp_var_flag_128x128_idx32)[lVar40 * 2] +
                                      (&DAT_00466cf4)[lVar40 * 2])];
                  if (((pMVar12 != (MB_MODE_INFO *)0x0) &&
                      ((&DAT_00466cf4)[lVar40 * 2] + iVar63 < (cpi->common).mi_params.mi_cols)) &&
                     ((&set_low_temp_var_flag_128x128_idx32)[lVar40 * 2] + iVar56 <
                      (cpi->common).mi_params.mi_rows)) {
                    BVar2 = pMVar12->bsize;
                    if (BVar2 - 6 < 3) {
                      lVar74 = local_2f8;
                      for (lVar33 = 0; lVar33 != 4; lVar33 = lVar33 + 1) {
                        if ((long)*(int *)(*(long *)(v + 5) + lVar74) < threshold_01 >> 8) {
                          puVar36[lVar33] = '\x01';
                        }
                        lVar74 = lVar74 + 0xa90;
                      }
                    }
                    else if ((BVar2 == BLOCK_32X32) &&
                            ((long)*(int *)(lVar40 * 0x2a90 + 0x5c +
                                           lVar26 * 0xaa90 + *(long *)(v + 5)) <
                             threshold_00 * 5 >> 3)) {
                      puVar55[lVar26 * 4 + 0x19 + lVar40] = '\x01';
                    }
                  }
                  puVar36 = puVar36 + 4;
                  local_2f8 = local_2f8 + 0x2a90;
                }
              }
            }
            puVar70 = puVar70 + 2;
            local_290 = local_290 + 0xaa90;
            puVar61 = puVar61 + 2;
            local_2e8 = local_2e8 + 0xaa90;
            puVar71 = puVar71 + 0x10;
            local_2c0 = local_2c0 + 0xaa90;
          }
        }
        goto LAB_00224e53;
      }
      iVar56 = v->variance;
    }
    if ((long)iVar56 < local_208 >> 1) {
      *puVar55 = '\x01';
    }
  }
LAB_00224e53:
  aom_free(v);
  return 0;
}

Assistant:

int av1_choose_var_based_partitioning(AV1_COMP *cpi, const TileInfo *const tile,
                                      ThreadData *td, MACROBLOCK *x, int mi_row,
                                      int mi_col) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, choose_var_based_partitioning_time);
#endif
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  const int64_t *const vbp_thresholds = cpi->vbp_info.thresholds;
  PART_EVAL_STATUS force_split[85];
  int avg_64x64;
  int max_var_32x32[4];
  int min_var_32x32[4];
  int var_32x32;
  int var_64x64;
  int min_var_64x64 = INT_MAX;
  int max_var_64x64 = 0;
  int avg_16x16[4][4];
  int maxvar_16x16[4][4];
  int minvar_16x16[4][4];
  const uint8_t *src_buf;
  const uint8_t *dst_buf;
  int dst_stride;
  unsigned int uv_sad[MAX_MB_PLANE - 1];
  NOISE_LEVEL noise_level = kLow;
  bool is_zero_motion = true;
  bool scaled_ref_last = false;
  struct scale_factors sf_no_scale;
  av1_setup_scale_factors_for_frame(&sf_no_scale, cm->width, cm->height,
                                    cm->width, cm->height);

  bool is_key_frame =
      (frame_is_intra_only(cm) ||
       (cpi->ppi->use_svc &&
        cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame));

  assert(cm->seq_params->sb_size == BLOCK_64X64 ||
         cm->seq_params->sb_size == BLOCK_128X128);
  const bool is_small_sb = (cm->seq_params->sb_size == BLOCK_64X64);
  const int num_64x64_blocks = is_small_sb ? 1 : 4;

  unsigned int y_sad = UINT_MAX;
  unsigned int y_sad_g = UINT_MAX;
  unsigned int y_sad_alt = UINT_MAX;
  unsigned int y_sad_last = UINT_MAX;
  BLOCK_SIZE bsize = is_small_sb ? BLOCK_64X64 : BLOCK_128X128;

  // Force skip encoding for all superblocks on slide change for
  // non_reference_frames.
  if (cpi->sf.rt_sf.skip_encoding_non_reference_slide_change &&
      cpi->rc.high_source_sad && cpi->ppi->rtc_ref.non_reference_frame) {
    MB_MODE_INFO **mi = cm->mi_params.mi_grid_base +
                        get_mi_grid_idx(&cm->mi_params, mi_row, mi_col);
    av1_set_fixed_partitioning(cpi, tile, mi, mi_row, mi_col, bsize);
    x->force_zeromv_skip_for_sb = 1;
    return 0;
  }

  // Ref frame used in partitioning.
  MV_REFERENCE_FRAME ref_frame_partition = LAST_FRAME;

  int64_t thresholds[5] = { vbp_thresholds[0], vbp_thresholds[1],
                            vbp_thresholds[2], vbp_thresholds[3],
                            vbp_thresholds[4] };

  const int segment_id = xd->mi[0]->segment_id;
  uint64_t blk_sad = 0;
  if (cpi->src_sad_blk_64x64 != NULL &&
      cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1) {
    const int sb_size_by_mb = (cm->seq_params->sb_size == BLOCK_128X128)
                                  ? (cm->seq_params->mib_size >> 1)
                                  : cm->seq_params->mib_size;
    const int sb_cols =
        (cm->mi_params.mi_cols + sb_size_by_mb - 1) / sb_size_by_mb;
    const int sbi_col = mi_col / sb_size_by_mb;
    const int sbi_row = mi_row / sb_size_by_mb;
    blk_sad = cpi->src_sad_blk_64x64[sbi_col + sbi_row * sb_cols];
  }

  const bool is_segment_id_boosted =
      cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ && cm->seg.enabled &&
      cyclic_refresh_segment_id_boosted(segment_id);
  const int qindex =
      is_segment_id_boosted
          ? av1_get_qindex(&cm->seg, segment_id, cm->quant_params.base_qindex)
          : cm->quant_params.base_qindex;
  set_vbp_thresholds(
      cpi, thresholds, blk_sad, qindex, x->content_state_sb.low_sumdiff,
      x->content_state_sb.source_sad_nonrd, x->content_state_sb.source_sad_rd,
      is_segment_id_boosted, x->content_state_sb.lighting_change);

  src_buf = x->plane[AOM_PLANE_Y].src.buf;
  int src_stride = x->plane[AOM_PLANE_Y].src.stride;

  // Index for force_split: 0 for 64x64, 1-4 for 32x32 blocks,
  // 5-20 for the 16x16 blocks.
  force_split[0] = PART_EVAL_ALL;
  memset(x->part_search_info.variance_low, 0,
         sizeof(x->part_search_info.variance_low));

  // Check if LAST frame is NULL, and if so, treat this frame
  // as a key frame, for the purpose of the superblock partitioning.
  // LAST == NULL can happen in cases where enhancement spatial layers are
  // enabled dyanmically and the only reference is the spatial(GOLDEN).
  // If LAST frame has a different resolution: set the scaled_ref_last flag
  // and check if ref_scaled is NULL.
  if (!frame_is_intra_only(cm)) {
    const YV12_BUFFER_CONFIG *ref = get_ref_frame_yv12_buf(cm, LAST_FRAME);
    if (ref == NULL) {
      is_key_frame = true;
    } else if (ref->y_crop_height != cm->height ||
               ref->y_crop_width != cm->width) {
      scaled_ref_last = true;
      const YV12_BUFFER_CONFIG *ref_scaled =
          av1_get_scaled_ref_frame(cpi, LAST_FRAME);
      if (ref_scaled == NULL) is_key_frame = true;
    }
  }

  x->source_variance = UINT_MAX;
  // For nord_pickmode: compute source_variance, only for superblocks with
  // some motion for now. This input can then be used to bias the partitioning
  // or the chroma_check.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode &&
      x->content_state_sb.source_sad_nonrd > kLowSad)
    x->source_variance = av1_get_perpixel_variance_facade(
        cpi, xd, &x->plane[0].src, cm->seq_params->sb_size, AOM_PLANE_Y);

  if (!is_key_frame) {
    setup_planes(cpi, x, &y_sad, &y_sad_g, &y_sad_alt, &y_sad_last,
                 &ref_frame_partition, &sf_no_scale, mi_row, mi_col,
                 is_small_sb, scaled_ref_last);

    MB_MODE_INFO *mi = xd->mi[0];
    // Use reference SB directly for zero mv.
    if (mi->mv[0].as_int != 0) {
      dst_buf = xd->plane[AOM_PLANE_Y].dst.buf;
      dst_stride = xd->plane[AOM_PLANE_Y].dst.stride;
      is_zero_motion = false;
    } else {
      dst_buf = xd->plane[AOM_PLANE_Y].pre[0].buf;
      dst_stride = xd->plane[AOM_PLANE_Y].pre[0].stride;
    }
  } else {
    dst_buf = NULL;
    dst_stride = 0;
  }

  // check and set the color sensitivity of sb.
  av1_zero(uv_sad);
  chroma_check(cpi, x, bsize, y_sad_last, y_sad_g, y_sad_alt, is_key_frame,
               is_zero_motion, uv_sad);

  x->force_zeromv_skip_for_sb = 0;

  VP128x128 *vt;
  AOM_CHECK_MEM_ERROR(xd->error_info, vt, aom_malloc(sizeof(*vt)));
  vt->split = td->vt64x64;

  // If the superblock is completely static (zero source sad) and
  // the y_sad (relative to LAST ref) is very small, take the sb_size partition
  // and exit, and force zeromv_last skip mode for nonrd_pickmode.
  // Only do this on the base segment (so the QP-boosted segment, if applied,
  // can still continue cleaning/ramping up the quality).
  // Condition on color uv_sad is also added.
  if (!is_key_frame && cpi->sf.rt_sf.part_early_exit_zeromv &&
      cpi->rc.frames_since_key > 30 && segment_id == CR_SEGMENT_ID_BASE &&
      ref_frame_partition == LAST_FRAME && xd->mi[0]->mv[0].as_int == 0) {
    // Exit here, if zero mv skip flag is set at SB level.
    if (set_force_zeromv_skip_for_sb(cpi, x, tile, vt, uv_sad, mi_row, mi_col,
                                     y_sad, bsize))
      return 0;
  }

  if (cpi->noise_estimate.enabled)
    noise_level = av1_noise_estimate_extract_level(&cpi->noise_estimate);

  // Fill in the entire tree of 8x8 (for inter frames) or 4x4 (for key frames)
  // variances for splits.
  fill_variance_tree_leaves(cpi, x, vt, force_split, avg_16x16, maxvar_16x16,
                            minvar_16x16, thresholds, src_buf, src_stride,
                            dst_buf, dst_stride, is_key_frame, is_small_sb);

  avg_64x64 = 0;
  for (int blk64_idx = 0; blk64_idx < num_64x64_blocks; ++blk64_idx) {
    max_var_32x32[blk64_idx] = 0;
    min_var_32x32[blk64_idx] = INT_MAX;
    const int blk64_scale_idx = blk64_idx << 2;
    for (int lvl1_idx = 0; lvl1_idx < 4; lvl1_idx++) {
      const int lvl1_scale_idx = (blk64_scale_idx + lvl1_idx) << 2;
      for (int lvl2_idx = 0; lvl2_idx < 4; lvl2_idx++) {
        if (!is_key_frame) continue;
        VP16x16 *vtemp = &vt->split[blk64_idx].split[lvl1_idx].split[lvl2_idx];
        for (int lvl3_idx = 0; lvl3_idx < 4; lvl3_idx++)
          fill_variance_tree(&vtemp->split[lvl3_idx], BLOCK_8X8);
        fill_variance_tree(vtemp, BLOCK_16X16);
        // If variance of this 16x16 block is above the threshold, force block
        // to split. This also forces a split on the upper levels.
        get_variance(&vtemp->part_variances.none);
        if (vtemp->part_variances.none.variance > thresholds[3]) {
          const int split_index = 21 + lvl1_scale_idx + lvl2_idx;
          force_split[split_index] =
              cpi->sf.rt_sf.vbp_prune_16x16_split_using_min_max_sub_blk_var
                  ? get_part_eval_based_on_sub_blk_var(vtemp, thresholds[3])
                  : PART_EVAL_ONLY_SPLIT;
          force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
          force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
          force_split[0] = PART_EVAL_ONLY_SPLIT;
        }
      }
      fill_variance_tree(&vt->split[blk64_idx].split[lvl1_idx], BLOCK_32X32);
      // If variance of this 32x32 block is above the threshold, or if its above
      // (some threshold of) the average variance over the sub-16x16 blocks,
      // then force this block to split. This also forces a split on the upper
      // (64x64) level.
      uint64_t frame_sad_thresh = 20000;
      const int is_360p_or_smaller = cm->width * cm->height <= RESOLUTION_360P;
      if (cpi->svc.number_temporal_layers > 2 &&
          cpi->svc.temporal_layer_id == 0)
        frame_sad_thresh = frame_sad_thresh << 1;
      if (force_split[5 + blk64_scale_idx + lvl1_idx] == PART_EVAL_ALL) {
        get_variance(&vt->split[blk64_idx].split[lvl1_idx].part_variances.none);
        var_32x32 =
            vt->split[blk64_idx].split[lvl1_idx].part_variances.none.variance;
        max_var_32x32[blk64_idx] = AOMMAX(var_32x32, max_var_32x32[blk64_idx]);
        min_var_32x32[blk64_idx] = AOMMIN(var_32x32, min_var_32x32[blk64_idx]);
        const int max_min_var_16X16_diff = (maxvar_16x16[blk64_idx][lvl1_idx] -
                                            minvar_16x16[blk64_idx][lvl1_idx]);

        if (var_32x32 > thresholds[2] ||
            (!is_key_frame && var_32x32 > (thresholds[2] >> 1) &&
             var_32x32 > (avg_16x16[blk64_idx][lvl1_idx] >> 1))) {
          force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
          force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
          force_split[0] = PART_EVAL_ONLY_SPLIT;
        } else if (!is_key_frame && is_360p_or_smaller &&
                   ((max_min_var_16X16_diff > (thresholds[2] >> 1) &&
                     maxvar_16x16[blk64_idx][lvl1_idx] > thresholds[2]) ||
                    (cpi->sf.rt_sf.prefer_large_partition_blocks &&
                     x->content_state_sb.source_sad_nonrd > kLowSad &&
                     cpi->rc.frame_source_sad < frame_sad_thresh &&
                     maxvar_16x16[blk64_idx][lvl1_idx] > (thresholds[2] >> 4) &&
                     maxvar_16x16[blk64_idx][lvl1_idx] >
                         (minvar_16x16[blk64_idx][lvl1_idx] << 2)))) {
          force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
          force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
          force_split[0] = PART_EVAL_ONLY_SPLIT;
        }
      }
    }
    if (force_split[1 + blk64_idx] == PART_EVAL_ALL) {
      fill_variance_tree(&vt->split[blk64_idx], BLOCK_64X64);
      get_variance(&vt->split[blk64_idx].part_variances.none);
      var_64x64 = vt->split[blk64_idx].part_variances.none.variance;
      max_var_64x64 = AOMMAX(var_64x64, max_var_64x64);
      min_var_64x64 = AOMMIN(var_64x64, min_var_64x64);
      // If the difference of the max-min variances of sub-blocks or max
      // variance of a sub-block is above some threshold of then force this
      // block to split. Only checking this for noise level >= medium, if
      // encoder is in SVC or if we already forced large blocks.
      const int max_min_var_32x32_diff =
          max_var_32x32[blk64_idx] - min_var_32x32[blk64_idx];
      const int check_max_var = max_var_32x32[blk64_idx] > thresholds[1] >> 1;
      const bool check_noise_lvl = noise_level >= kMedium ||
                                   cpi->ppi->use_svc ||
                                   cpi->sf.rt_sf.prefer_large_partition_blocks;
      const int64_t set_threshold = 3 * (thresholds[1] >> 3);

      if (!is_key_frame && max_min_var_32x32_diff > set_threshold &&
          check_max_var && check_noise_lvl) {
        force_split[1 + blk64_idx] = PART_EVAL_ONLY_SPLIT;
        force_split[0] = PART_EVAL_ONLY_SPLIT;
      }
      avg_64x64 += var_64x64;
    }
    if (is_small_sb) force_split[0] = PART_EVAL_ONLY_SPLIT;
  }

  if (force_split[0] == PART_EVAL_ALL) {
    fill_variance_tree(vt, BLOCK_128X128);
    get_variance(&vt->part_variances.none);
    const int set_avg_64x64 = (9 * avg_64x64) >> 5;
    if (!is_key_frame && vt->part_variances.none.variance > set_avg_64x64)
      force_split[0] = PART_EVAL_ONLY_SPLIT;

    if (!is_key_frame &&
        (max_var_64x64 - min_var_64x64) > 3 * (thresholds[0] >> 3) &&
        max_var_64x64 > thresholds[0] >> 1)
      force_split[0] = PART_EVAL_ONLY_SPLIT;
  }

  if (mi_col + 32 > tile->mi_col_end || mi_row + 32 > tile->mi_row_end ||
      !set_vt_partitioning(cpi, xd, tile, vt, BLOCK_128X128, mi_row, mi_col,
                           thresholds[0], BLOCK_16X16, force_split[0])) {
    for (int blk64_idx = 0; blk64_idx < num_64x64_blocks; ++blk64_idx) {
      const int x64_idx = GET_BLK_IDX_X(blk64_idx, 4);
      const int y64_idx = GET_BLK_IDX_Y(blk64_idx, 4);
      const int blk64_scale_idx = blk64_idx << 2;

      // Now go through the entire structure, splitting every block size until
      // we get to one that's got a variance lower than our threshold.
      if (set_vt_partitioning(cpi, xd, tile, &vt->split[blk64_idx], BLOCK_64X64,
                              mi_row + y64_idx, mi_col + x64_idx, thresholds[1],
                              BLOCK_16X16, force_split[1 + blk64_idx]))
        continue;
      for (int lvl1_idx = 0; lvl1_idx < 4; ++lvl1_idx) {
        const int x32_idx = GET_BLK_IDX_X(lvl1_idx, 3);
        const int y32_idx = GET_BLK_IDX_Y(lvl1_idx, 3);
        const int lvl1_scale_idx = (blk64_scale_idx + lvl1_idx) << 2;
        if (set_vt_partitioning(
                cpi, xd, tile, &vt->split[blk64_idx].split[lvl1_idx],
                BLOCK_32X32, (mi_row + y64_idx + y32_idx),
                (mi_col + x64_idx + x32_idx), thresholds[2], BLOCK_16X16,
                force_split[5 + blk64_scale_idx + lvl1_idx]))
          continue;
        for (int lvl2_idx = 0; lvl2_idx < 4; ++lvl2_idx) {
          const int x16_idx = GET_BLK_IDX_X(lvl2_idx, 2);
          const int y16_idx = GET_BLK_IDX_Y(lvl2_idx, 2);
          const int split_index = 21 + lvl1_scale_idx + lvl2_idx;
          VP16x16 *vtemp =
              &vt->split[blk64_idx].split[lvl1_idx].split[lvl2_idx];
          if (set_vt_partitioning(cpi, xd, tile, vtemp, BLOCK_16X16,
                                  mi_row + y64_idx + y32_idx + y16_idx,
                                  mi_col + x64_idx + x32_idx + x16_idx,
                                  thresholds[3], BLOCK_8X8,
                                  force_split[split_index]))
            continue;
          for (int lvl3_idx = 0; lvl3_idx < 4; ++lvl3_idx) {
            const int x8_idx = GET_BLK_IDX_X(lvl3_idx, 1);
            const int y8_idx = GET_BLK_IDX_Y(lvl3_idx, 1);
            set_block_size(cpi, (mi_row + y64_idx + y32_idx + y16_idx + y8_idx),
                           (mi_col + x64_idx + x32_idx + x16_idx + x8_idx),
                           BLOCK_8X8);
          }
        }
      }
    }
  }

  if (cpi->sf.rt_sf.short_circuit_low_temp_var) {
    set_low_temp_var_flag(cpi, &x->part_search_info, xd, vt, thresholds,
                          ref_frame_partition, mi_col, mi_row, is_small_sb);
  }

  aom_free(vt);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, choose_var_based_partitioning_time);
#endif
  return 0;
}